

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SampleConsensus.hpp
# Opt level: O1

void __thiscall
opengv::sac::SampleConsensus<opengv::sac_problems::relative_pose::CentralRelativePoseSacProblem>::
~SampleConsensus(SampleConsensus<opengv::sac_problems::relative_pose::CentralRelativePoseSacProblem>
                 *this)

{
  code *pcVar1;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

opengv::sac::SampleConsensus<P>::~SampleConsensus(){}